

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codecvt.cpp
# Opt level: O2

void test_codecvt_conv(void)

{
  int iVar1;
  ostream *poVar2;
  locale *__other;
  utf8_codecvt<wchar_t> *this;
  codecvt *cvt;
  runtime_error *this_00;
  int m;
  bool bVar3;
  allocator local_49;
  locale l;
  string local_40;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Conversions ");
  std::endl<char,std::char_traits<char>>(poVar2);
  __other = (locale *)std::locale::classic();
  this = (utf8_codecvt<wchar_t> *)operator_new(0x18);
  booster::locale::utf8_codecvt<wchar_t>::utf8_codecvt(this,0);
  std::locale::locale<booster::locale::utf8_codecvt<wchar_t>>(&l,__other,this);
  cvt = std::use_facet<std::codecvt<wchar_t,char,__mbstate_t>>(&l);
  test_counter = test_counter + 1;
  iVar1 = (**(code **)(*(long *)cvt + 0x40))(cvt);
  if (iVar1 != 4) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x9a);
    poVar2 = std::operator<<(poVar2," cvt.max_length()==4");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = error_counter + 1;
    bVar3 = -1 < error_counter;
    error_counter = iVar1;
    if (bVar3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_40,"Error limits reached, stopping unit test",&local_49);
      booster::runtime_error::runtime_error(this_00,&local_40);
      __cxa_throw(this_00,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  for (iVar1 = 1; iVar1 != 0x1e; iVar1 = iVar1 + 1) {
    for (m = 1; m != 0x11; m = m + 1) {
      test_codecvt_in_n_m((cvt_type *)cvt,iVar1,m);
      test_codecvt_out_n_m((cvt_type *)cvt,iVar1,m);
    }
  }
  std::locale::~locale(&l);
  return;
}

Assistant:

void test_codecvt_conv()
{
    std::cout << "Conversions " << std::endl;
    std::locale l(std::locale::classic(),new booster::locale::utf8_codecvt<wchar_t>());
 
    cvt_type const &cvt = std::use_facet<cvt_type>(l);

    TEST(cvt.max_length()==4);
    
    for(int i=1;i<=(int)strlen(utf8_name)+1;i++) {
        for(int j=1;j<=(int)wcslen(wide_name)+1;j++) {
            try {
                test_codecvt_in_n_m(cvt,i,j);
                test_codecvt_out_n_m(cvt,i,j);
            }
            catch(...) {
                std::cerr << "Wlen=" <<j << " Nlen=" << i << std::endl;
                throw;
            }
        }
    }    
}